

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

void zmDivMont(word *b,word *divident,word *a,qr_o *r,void *stack)

{
  void *stack_00;
  
  stack_00 = (void *)((long)stack + r->n * 8);
  zmInvMont((word *)stack,a,r,stack_00);
  zmMulMont(b,divident,(word *)stack,r,stack_00);
  return;
}

Assistant:

static void zmDivMont(word b[], const word divident[], const word a[],
	const qr_o* r, void* stack)
{
	word* c = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(divident, r));
	ASSERT(zmIsIn(a, r));
	stack = c + r->n;
	// c <- a^{(-1)} (в кольце Монтгомери)
	zmInvMont(c, a, r, stack);
	// b <- divident * c
	zmMulMont(b, divident, c, r, stack);
}